

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::PlusExp(SQCompiler *this)

{
  SQCompiler *in_RDI;
  SQInteger in_stack_00000010;
  offset_in_SQCompiler_to_subr in_stack_00000018;
  SQOpcode in_stack_0000002c;
  SQCompiler *in_stack_00000030;
  SQCompiler *in_stack_fffffffffffffff0;
  
  MultExp(in_stack_fffffffffffffff0);
  while ((in_RDI->_token == 0x2b || (in_RDI->_token == 0x2d))) {
    ChooseArithOpByToken(in_RDI,in_RDI->_token);
    BIN_EXP<void(SQCompiler::*)()>
              (in_stack_00000030,in_stack_0000002c,in_stack_00000018,in_stack_00000010);
  }
  return;
}

Assistant:

void PlusExp()
    {
        MultExp();
        for(;;) switch(_token) {
        case _SC('+'): case _SC('-'):
            BIN_EXP(ChooseArithOpByToken(_token), &SQCompiler::MultExp); break;
        default: return;
        }
    }